

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

bool tinyusdz::orthonormalize_basis(double3 *tx,double3 *ty,double3 *tz,bool normalize,double eps)

{
  bool bVar1;
  undefined3 in_register_00000009;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double3 local_128;
  int local_10c;
  double3 local_108;
  double3 local_e8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  double3 local_a8;
  double3 local_88;
  double3 local_68;
  double local_48;
  undefined8 uStack_40;
  
  local_10c = CONCAT31(in_register_00000009,normalize);
  local_b0 = eps;
  if (local_10c == 0) {
    vnormalize(tx,2.220446049250313e-16);
    vnormalize(ty,2.220446049250313e-16);
    vnormalize(tz,2.220446049250313e-16);
  }
  else {
    vnormalize(tx,2.220446049250313e-16);
    tx->_M_elems[2] = local_128._M_elems[2];
    tx->_M_elems[0] = local_128._M_elems[0];
    tx->_M_elems[1] = local_128._M_elems[1];
    vnormalize(ty,2.220446049250313e-16);
    ty->_M_elems[2] = local_128._M_elems[2];
    ty->_M_elems[0] = local_128._M_elems[0];
    ty->_M_elems[1] = local_128._M_elems[1];
    vnormalize(tz,2.220446049250313e-16);
    tz->_M_elems[2] = local_128._M_elems[2];
    tz->_M_elems[0] = local_128._M_elems[0];
    tz->_M_elems[1] = local_128._M_elems[1];
    local_128._M_elems[2] = tx->_M_elems[2];
    local_128._M_elems[0] = tx->_M_elems[0];
    local_128._M_elems[1] = tx->_M_elems[1];
    local_e8._M_elems[0] = ty->_M_elems[0];
    local_e8._M_elems[1] = ty->_M_elems[1];
    local_e8._M_elems[2] = ty->_M_elems[2];
    local_108._M_elems[0] = tz->_M_elems[0];
    local_108._M_elems[1] = tz->_M_elems[1];
    local_108._M_elems[2] = tz->_M_elems[2];
  }
  if (ABS(local_128._M_elems[0] - local_e8._M_elems[0]) <= local_b0) {
LAB_003126db:
    if (local_b0 < ABS(local_128._M_elems[1] - local_e8._M_elems[1])) {
      dVar10 = ABS(local_128._M_elems[1]);
      dVar7 = ABS(local_e8._M_elems[1]);
      dVar9 = dVar7;
      if (dVar7 <= dVar10) {
        dVar9 = dVar10;
      }
      if ((double)(~-(ulong)NAN(dVar10) & (ulong)dVar9 | -(ulong)NAN(dVar10) & (ulong)dVar7) *
          local_b0 < ABS(local_128._M_elems[1] - local_e8._M_elems[1])) goto LAB_00312795;
    }
    if (ABS(local_128._M_elems[2] - local_e8._M_elems[2]) <= local_b0) {
      return false;
    }
    dVar10 = ABS(local_128._M_elems[2]);
    dVar7 = ABS(local_e8._M_elems[2]);
    dVar9 = dVar7;
    if (dVar7 <= dVar10) {
      dVar9 = dVar10;
    }
    if (ABS(local_128._M_elems[2] - local_e8._M_elems[2]) <=
        (double)(~-(ulong)NAN(dVar10) & (ulong)dVar9 | -(ulong)NAN(dVar10) & (ulong)dVar7) *
        local_b0) {
      return false;
    }
  }
  else {
    dVar10 = ABS(local_128._M_elems[0]);
    dVar7 = ABS(local_e8._M_elems[0]);
    dVar9 = dVar7;
    if (dVar7 <= dVar10) {
      dVar9 = dVar10;
    }
    if (ABS(local_128._M_elems[0] - local_e8._M_elems[0]) <=
        (double)(~-(ulong)NAN(dVar10) & (ulong)dVar9 | -(ulong)NAN(dVar10) & (ulong)dVar7) *
        local_b0) goto LAB_003126db;
  }
LAB_00312795:
  if (ABS(local_128._M_elems[0] - local_108._M_elems[0]) <= local_b0) {
LAB_003127ec:
    if (local_b0 < ABS(local_128._M_elems[1] - local_108._M_elems[1])) {
      dVar10 = ABS(local_128._M_elems[1]);
      dVar7 = ABS(local_108._M_elems[1]);
      dVar9 = dVar7;
      if (dVar7 <= dVar10) {
        dVar9 = dVar10;
      }
      if ((double)(~-(ulong)NAN(dVar10) & (ulong)dVar9 | -(ulong)NAN(dVar10) & (ulong)dVar7) *
          local_b0 < ABS(local_128._M_elems[1] - local_108._M_elems[1])) goto LAB_003128a6;
    }
    if (ABS(local_128._M_elems[2] - local_108._M_elems[2]) <= local_b0) {
      return false;
    }
    dVar10 = ABS(local_128._M_elems[2]);
    dVar7 = ABS(local_108._M_elems[2]);
    dVar9 = dVar7;
    if (dVar7 <= dVar10) {
      dVar9 = dVar10;
    }
    if (ABS(local_128._M_elems[2] - local_108._M_elems[2]) <=
        (double)(~-(ulong)NAN(dVar10) & (ulong)dVar9 | -(ulong)NAN(dVar10) & (ulong)dVar7) *
        local_b0) {
      return false;
    }
  }
  else {
    dVar7 = ABS(local_128._M_elems[0]);
    dVar10 = ABS(local_108._M_elems[0]);
    dVar9 = dVar10;
    if (dVar10 <= dVar7) {
      dVar9 = dVar7;
    }
    if (ABS(local_128._M_elems[0] - local_108._M_elems[0]) <=
        (double)(~-(ulong)NAN(dVar7) & (ulong)dVar9 | -(ulong)NAN(dVar7) & (ulong)dVar10) * local_b0
       ) goto LAB_003127ec;
  }
LAB_003128a6:
  if (local_b0 < ABS(local_e8._M_elems[0] - local_108._M_elems[0])) {
    dVar9 = ABS(local_e8._M_elems[0]);
    dVar10 = ABS(local_108._M_elems[0]);
    dVar7 = dVar10;
    if (dVar10 <= dVar9) {
      dVar7 = dVar9;
    }
    if ((double)(~-(ulong)NAN(dVar9) & (ulong)dVar7 | -(ulong)NAN(dVar9) & (ulong)dVar10) * local_b0
        < ABS(local_e8._M_elems[0] - local_108._M_elems[0])) goto LAB_003129b1;
  }
  if (local_b0 < ABS(local_e8._M_elems[1] - local_108._M_elems[1])) {
    dVar10 = ABS(local_e8._M_elems[1]);
    dVar7 = ABS(local_108._M_elems[1]);
    dVar9 = dVar7;
    if (dVar7 <= dVar10) {
      dVar9 = dVar10;
    }
    if ((double)(~-(ulong)NAN(dVar10) & (ulong)dVar9 | -(ulong)NAN(dVar10) & (ulong)dVar7) *
        local_b0 < ABS(local_e8._M_elems[1] - local_108._M_elems[1])) goto LAB_003129b1;
  }
  if (local_b0 < ABS(local_e8._M_elems[2] - local_108._M_elems[2])) {
    dVar10 = ABS(local_e8._M_elems[2]);
    dVar7 = ABS(local_108._M_elems[2]);
    dVar9 = dVar7;
    if (dVar7 <= dVar10) {
      dVar9 = dVar10;
    }
    if ((double)(~-(ulong)NAN(dVar10) & (ulong)dVar9 | -(ulong)NAN(dVar10) & (ulong)dVar7) *
        local_b0 < ABS(local_e8._M_elems[2] - local_108._M_elems[2])) {
LAB_003129b1:
      local_b0 = local_b0 * local_b0;
      iVar2 = 0x14;
      do {
        dVar11 = tx->_M_elems[0];
        dVar5 = tx->_M_elems[1];
        dVar7 = ty->_M_elems[0];
        dVar9 = tz->_M_elems[0];
        uVar3 = SUB84(dVar9,0);
        uVar4 = (undefined4)((ulong)dVar9 >> 0x20);
        dVar10 = tz->_M_elems[1];
        dVar8 = tz->_M_elems[2];
        dVar20 = local_128._M_elems[2] * dVar8 +
                 local_128._M_elems[0] * dVar9 + dVar10 * local_128._M_elems[1];
        dVar14 = dVar9 - local_128._M_elems[0] * dVar20;
        dVar12 = dVar10 - dVar20 * local_128._M_elems[1];
        dVar13 = dVar8 - dVar20 * local_128._M_elems[2];
        dVar6 = ty->_M_elems[1];
        uStack_40 = 0;
        dVar23 = local_e8._M_elems[2] * dVar13 +
                 local_e8._M_elems[0] * dVar14 + local_e8._M_elems[1] * dVar12;
        dVar20 = tx->_M_elems[2];
        dVar15 = ty->_M_elems[2];
        dVar16 = local_e8._M_elems[2] * dVar20 +
                 local_e8._M_elems[0] * dVar11 + dVar5 * local_e8._M_elems[1];
        dVar17 = local_128._M_elems[2] * dVar15 +
                 local_128._M_elems[0] * dVar7 + dVar6 * local_128._M_elems[1];
        dVar24 = dVar11 - local_e8._M_elems[0] * dVar16;
        dVar25 = dVar7 - local_128._M_elems[0] * dVar17;
        dVar18 = dVar5 - local_e8._M_elems[1] * dVar16;
        dVar19 = dVar6 - local_128._M_elems[1] * dVar17;
        dVar16 = dVar20 - dVar16 * local_e8._M_elems[2];
        dVar17 = dVar15 - dVar17 * local_128._M_elems[2];
        dVar21 = local_108._M_elems[2] * dVar16 +
                 local_108._M_elems[0] * dVar24 + local_108._M_elems[1] * dVar18;
        dVar22 = local_108._M_elems[2] * dVar17 +
                 local_108._M_elems[0] * dVar25 + local_108._M_elems[1] * dVar19;
        local_68._M_elems[0] = ((dVar24 - local_108._M_elems[0] * dVar21) + dVar11) * 0.5;
        local_88._M_elems[0] = ((dVar25 - local_108._M_elems[0] * dVar22) + dVar7) * 0.5;
        local_68._M_elems[1] = ((dVar18 - local_108._M_elems[1] * dVar21) + dVar5) * 0.5;
        local_88._M_elems[1] = ((dVar19 - local_108._M_elems[1] * dVar22) + dVar6) * 0.5;
        local_68._M_elems[2] = ((dVar16 - dVar21 * local_108._M_elems[2]) + dVar20) * 0.5;
        local_88._M_elems[2] = ((dVar17 - dVar22 * local_108._M_elems[2]) + dVar15) * 0.5;
        local_a8._M_elems[0] = ((dVar14 - local_e8._M_elems[0] * dVar23) + dVar9) * 0.5;
        local_a8._M_elems[1] = ((dVar12 - dVar23 * local_e8._M_elems[1]) + dVar10) * 0.5;
        local_a8._M_elems[2] = ((dVar13 - dVar23 * local_e8._M_elems[2]) + dVar8) * 0.5;
        local_48 = dVar7;
        if ((char)local_10c != '\0') {
          vnormalize(&local_68,2.220446049250313e-16);
          local_68._M_elems[2] = local_b8;
          local_68._M_elems[0] = local_c8;
          local_68._M_elems[1] = dStack_c0;
          vnormalize(&local_88,2.220446049250313e-16);
          local_88._M_elems[2] = local_b8;
          local_88._M_elems[0] = local_c8;
          local_88._M_elems[1] = dStack_c0;
          vnormalize(&local_a8,2.220446049250313e-16);
          dVar5 = tx->_M_elems[1];
          dVar7 = ty->_M_elems[0];
          uVar3 = SUB84(tz->_M_elems[0],0);
          uVar4 = (undefined4)((ulong)tz->_M_elems[0] >> 0x20);
          dVar10 = tz->_M_elems[1];
          dVar8 = tz->_M_elems[2];
          dVar20 = tx->_M_elems[2];
          dVar15 = ty->_M_elems[2];
          dVar6 = ty->_M_elems[1];
          local_a8._M_elems[0] = local_c8;
          local_a8._M_elems[1] = dStack_c0;
          local_a8._M_elems[2] = local_b8;
        }
        dVar9 = (double)CONCAT44(uVar4,uVar3) - local_a8._M_elems[0];
        dVar11 = tx->_M_elems[0] - local_68._M_elems[0];
        dVar9 = (dVar8 - local_a8._M_elems[2]) * (dVar8 - local_a8._M_elems[2]) +
                dVar9 * dVar9 + (dVar10 - local_a8._M_elems[1]) * (dVar10 - local_a8._M_elems[1]) +
                (dVar15 - local_88._M_elems[2]) * (dVar15 - local_88._M_elems[2]) +
                (dVar7 - local_88._M_elems[0]) * (dVar7 - local_88._M_elems[0]) +
                (dVar6 - local_88._M_elems[1]) * (dVar6 - local_88._M_elems[1]) +
                (dVar20 - local_68._M_elems[2]) * (dVar20 - local_68._M_elems[2]) +
                dVar11 * dVar11 + (dVar5 - local_68._M_elems[1]) * (dVar5 - local_68._M_elems[1]);
        bVar1 = dVar9 < local_b0;
        if (dVar9 < local_b0) {
          return bVar1;
        }
        tx->_M_elems[2] = local_68._M_elems[2];
        tx->_M_elems[0] = local_68._M_elems[0];
        tx->_M_elems[1] = local_68._M_elems[1];
        ty->_M_elems[2] = local_88._M_elems[2];
        ty->_M_elems[0] = local_88._M_elems[0];
        ty->_M_elems[1] = local_88._M_elems[1];
        tz->_M_elems[2] = local_a8._M_elems[2];
        tz->_M_elems[0] = local_a8._M_elems[0];
        tz->_M_elems[1] = local_a8._M_elems[1];
        local_128._M_elems[2] = tx->_M_elems[2];
        local_128._M_elems[0] = tx->_M_elems[0];
        local_128._M_elems[1] = tx->_M_elems[1];
        local_e8._M_elems[2] = ty->_M_elems[2];
        local_e8._M_elems[0] = ty->_M_elems[0];
        local_e8._M_elems[1] = ty->_M_elems[1];
        local_108._M_elems[0] = local_a8._M_elems[0];
        local_108._M_elems[1] = local_a8._M_elems[1];
        local_108._M_elems[2] = local_a8._M_elems[2];
        if ((char)local_10c == '\0') {
          vnormalize(&local_128,2.220446049250313e-16);
          local_128._M_elems[2] = local_b8;
          local_128._M_elems[0] = local_c8;
          local_128._M_elems[1] = dStack_c0;
          vnormalize(&local_e8,2.220446049250313e-16);
          local_128._M_elems[2] = local_b8;
          local_128._M_elems[0] = local_c8;
          local_128._M_elems[1] = dStack_c0;
          vnormalize(&local_108,2.220446049250313e-16);
          local_128._M_elems[2] = local_b8;
          local_128._M_elems[0] = local_c8;
          local_128._M_elems[1] = dStack_c0;
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool orthonormalize_basis(value::double3 &tx, value::double3 &ty,
                          value::double3 &tz, const bool normalize,
                          const double eps) {
  value::double3 ax, bx, cx, ay, by, cy, az, bz, cz;

  if (normalize) {
    tx = vnormalize(tx);
    ty = vnormalize(ty);
    tz = vnormalize(tz);
    ax = tx;
    ay = ty;
    az = tz;
  } else {
    ax = vnormalize(tx);
    ay = vnormalize(ty);
    az = vnormalize(tz);
  }

  /* Check for colinear vectors. This is not only a quick-out: the
   * error computation below will evaluate to zero if there's no change
   * after an iteration, which can happen either because we have a good
   * solution or because the vectors are colinear.   So we have to check
   * the colinear case beforehand, or we'll get fooled in the error
   * computation.
   */
  if (math::is_close(ax, ay, eps) || math::is_close(ax, az, eps) ||
      math::is_close(ay, az, eps)) {
    return false;
  }

  constexpr int kMAX_ITERS = 20;
  int iter;
  for (iter = 0; iter < kMAX_ITERS; ++iter) {
    bx = tx;
    by = ty;
    bz = tz;

    bx = bx - vdot(ay, bx) * ay;
    bx = bx - vdot(az, bx) * az;

    by = by - vdot(ax, by) * ax;
    by = by - vdot(az, by) * az;

    bz = bz - vdot(ax, bz) * ax;
    bz = bz - vdot(ay, bz) * ay;

    cx = 0.5 * (tx + bx);
    cy = 0.5 * (ty + by);
    cz = 0.5 * (tz + bz);

    if (normalize) {
      cx = vnormalize(cx);
      cy = vnormalize(cy);
      cz = vnormalize(cz);
    }

    value::double3 xDiff = tx - cx;
    value::double3 yDiff = ty - cy;
    value::double3 zDiff = tz - cz;

    double error = vdot(xDiff, xDiff) + vdot(yDiff, yDiff) + vdot(zDiff, zDiff);

    // error is squared, so compare to squared tolerance
    if (error < (eps * eps)) {
      break;
    }

    tx = cx;
    ty = cy;
    tz = cz;

    ax = tx;
    ay = ty;
    az = tz;

    if (!normalize) {
      ax = vnormalize(ax);
      ax = vnormalize(ay);
      ax = vnormalize(az);
    }
  }

  return iter < kMAX_ITERS;
}